

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

void __thiscall Raytracer::Image::~Image(Image *this)

{
  long lVar1;
  
  if (0 < this->height) {
    lVar1 = 0;
    do {
      if (this->datas[lVar1] != (RGB *)0x0) {
        operator_delete__(this->datas[lVar1]);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < this->height);
  }
  if (this->datas != (RGB **)0x0) {
    operator_delete__(this->datas);
    return;
  }
  return;
}

Assistant:

Raytracer::Image::~Image() {
    for(int y = 0;y<height;y++){
        delete[] datas[y];
    }
    delete[] datas;
}